

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_mtree.c
# Opt level: O0

void test_read_format_mtree_filenames_only(void)

{
  archive_entry *paVar1;
  wchar_t unaff_retaddr;
  wchar_t unaff_retaddr_00;
  char *in_stack_00000008;
  undefined4 in_stack_00000010;
  wchar_t in_stack_00000014;
  archive *a;
  archive_entry *ae;
  wchar_t in_stack_00000028;
  archive *in_stack_ffffffffffffffd8;
  archive_entry *paVar2;
  archive_entry *entry;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  uint in_stack_ffffffffffffffe4;
  wchar_t in_stack_ffffffffffffffe8;
  wchar_t in_stack_ffffffffffffffec;
  wchar_t line;
  archive_entry *in_stack_fffffffffffffff8;
  
  assertion_make_file((char *)a,in_stack_00000014,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                      in_stack_fffffffffffffff8);
  paVar1 = (archive_entry *)archive_read_new();
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
  archive_read_support_filter_all(in_stack_ffffffffffffffd8);
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar1,(char *)0x18ce1a,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_support_format_all((archive *)paVar1);
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar2,(char *)0x18ce53,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_set_options
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(char *)paVar2
            );
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar1,(char *)0x18ce93,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_open_memory
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar1,
             0x18cea9);
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar2,(char *)0x18ced8,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (archive_entry **)paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar1,(char *)0x18cf16,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_entry_pathname(paVar1);
  uVar3 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr_00,(char *)in_stack_fffffffffffffff8,(char *)paVar2,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),ae,in_stack_00000028);
  archive_entry_mode(in_stack_fffffffffffffff8);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),0,(char *)0x18cf9a,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_entry_is_encrypted(in_stack_fffffffffffffff8);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),0,(char *)0x18cfd3,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_has_encrypted_entries
            ((archive *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(longlong)paVar2,
                      (char *)0x18d00f,(void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(archive_entry **)paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(longlong)paVar1,
                      (char *)0x18d04d,(void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_entry_pathname(paVar1);
  uVar3 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr_00,(char *)in_stack_fffffffffffffff8,(char *)paVar2,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),ae,in_stack_00000028);
  archive_entry_mode(in_stack_fffffffffffffff8);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),0,(char *)0x18d0d1,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_entry_is_encrypted(in_stack_fffffffffffffff8);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),0,(char *)0x18d10a,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_has_encrypted_entries
            ((archive *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(longlong)paVar2,
                      (char *)0x18d146,(void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(archive_entry **)paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(longlong)paVar1,
                      (char *)0x18d184,(void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_entry_pathname(paVar1);
  uVar3 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr_00,(char *)in_stack_fffffffffffffff8,(char *)paVar2,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),ae,in_stack_00000028);
  archive_entry_mode(in_stack_fffffffffffffff8);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),0,(char *)0x18d208,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_entry_is_encrypted(in_stack_fffffffffffffff8);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),0,(char *)0x18d241,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_has_encrypted_entries
            ((archive *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(longlong)paVar2,
                      (char *)0x18d27d,(void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(archive_entry **)paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(longlong)paVar1,
                      (char *)0x18d2bb,(void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_entry_pathname(paVar1);
  uVar3 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr_00,(char *)in_stack_fffffffffffffff8,(char *)paVar2,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),ae,in_stack_00000028);
  archive_entry_mode(in_stack_fffffffffffffff8);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),0,(char *)0x18d33f,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_entry_is_encrypted(in_stack_fffffffffffffff8);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),0,(char *)0x18d378,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_has_encrypted_entries
            ((archive *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(longlong)paVar2,
                      (char *)0x18d3b4,(void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(archive_entry **)paVar2);
  entry = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(longlong)paVar1,
                      (char *)0x18d3f2,(void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_entry_pathname(paVar1);
  uVar3 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr_00,(char *)in_stack_fffffffffffffff8,(char *)entry,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),ae,in_stack_00000028);
  archive_entry_mode(in_stack_fffffffffffffff8);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)entry >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),0,(char *)0x18d476,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_entry_is_encrypted(in_stack_fffffffffffffff8);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)entry >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),0,(char *)0x18d4af,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_has_encrypted_entries
            ((archive *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  paVar2 = entry;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)entry >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(longlong)entry,
                      (char *)0x18d4eb,(void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(archive_entry **)entry);
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(longlong)paVar2,
                      (char *)0x18d529,(void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_entry_pathname(paVar2);
  uVar3 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr_00,(char *)in_stack_fffffffffffffff8,(char *)paVar1,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),ae,in_stack_00000028);
  archive_entry_mode(in_stack_fffffffffffffff8);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),0,(char *)0x18d5ad,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_entry_is_encrypted(in_stack_fffffffffffffff8);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),0,(char *)0x18d5e6,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_has_encrypted_entries
            ((archive *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(longlong)paVar1,
                      (char *)0x18d622,(void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(archive_entry **)paVar1);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(longlong)paVar2,
                      (char *)0x18d661,(void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_file_count((archive *)paVar2);
  line = (wchar_t)((ulong)paVar2 >> 0x20);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,line,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),0,(char *)0x18d69c,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_close((archive *)0x18d6a6);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,line,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),0,(char *)0x18d6d4,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  archive_read_free((archive *)0x18d6de);
  assertion_equal_int((char *)in_stack_fffffffffffffff8,line,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),0,(char *)0x18d70c,
                      (void *)CONCAT44(in_stack_00000014,in_stack_00000010));
  return;
}

Assistant:

DEFINE_TEST(test_read_format_mtree_filenames_only)
{
	static char archive[] =
	    "/set type=file mode=0644\n"
	    "./a\n"
	    "./b\n"
	    "./c\n"
	    "./d\n"
	    "./e\n"
	    "./f mode=0444\n";
	struct archive_entry *ae;
	struct archive *a;

	assertMakeFile("file", 0644, "file contents");

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_options(a, "mtree:checkfs"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./a");	
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./b");
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./c");
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./d");
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./e");
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./f");
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0444);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(6, archive_file_count(a));
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}